

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O3

int main(int argc,char **argv)

{
  uint obj_size;
  tm *__tp;
  char *pcVar1;
  uint uVar2;
  int iters;
  uint uVar3;
  time_t now;
  time_t local_28;
  
  obj_size = 10000000;
  if (1 < argc) {
    obj_size = atoi(argv[1]);
  }
  local_28 = time((time_t *)0x0);
  puts("======");
  fflush(_stdout);
  printf("Average over %d iterations\n",(ulong)obj_size);
  fflush(_stdout);
  __tp = gmtime(&local_28);
  pcVar1 = asctime(__tp);
  iters = (int)pcVar1;
  printf("Current time (GMT): %s");
  puts(
      "\n*** WARNING ***: sys/resources.h was not found, so all times\n                 reported are wall-clock time, not user time"
      );
  test_all_maps<HashObject<4,4>>(obj_size,iters);
  test_all_maps<HashObject<8,8>>((int)obj_size / 2,iters);
  uVar3 = obj_size + 3;
  if (-1 < (int)obj_size) {
    uVar3 = obj_size;
  }
  uVar2 = obj_size + 0x1f;
  if (-1 < (int)obj_size) {
    uVar2 = obj_size;
  }
  test_all_maps<HashObject<16,16>>((int)uVar3 >> 2,iters);
  test_all_maps<HashObject<256,32>>((int)uVar2 >> 5,iters);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  int iters = kDefaultIters;
  if (argc > 1) {  // first arg is # of iterations
    iters = atoi(argv[1]);
  }

  stamp_run(iters);

#ifndef HAVE_SYS_RESOURCE_H
  printf(
      "\n*** WARNING ***: sys/resources.h was not found, so all times\n"
      "                 reported are wall-clock time, not user time\n");
#endif

  // It would be nice to set these at run-time, but by setting them at
  // compile-time, we allow optimizations that make it as fast to use
  // a HashObject as it would be to use just a straight int/char
  // buffer.  To keep memory use similar, we normalize the number of
  // iterations based on size.
  if (FLAGS_test_4_bytes) test_all_maps<HashObject<4, 4>>(4, iters / 1);
  if (FLAGS_test_8_bytes) test_all_maps<HashObject<8, 8>>(8, iters / 2);
  if (FLAGS_test_16_bytes) test_all_maps<HashObject<16, 16>>(16, iters / 4);
  if (FLAGS_test_256_bytes)
    test_all_maps<HashObject<256, 32>>(256, iters / 32);

  return 0;
}